

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfLineOrderAttribute.cpp
# Opt level: O0

void __thiscall
Imf_2_5::TypedAttribute<Imf_2_5::LineOrder>::readValueFrom
          (TypedAttribute<Imf_2_5::LineOrder> *this,IStream *is,int size,int version)

{
  uchar *in_RDI;
  uchar tmp;
  undefined7 in_stack_ffffffffffffffe0;
  byte in_stack_ffffffffffffffe7;
  
  Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
            ((IStream *)CONCAT17(in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe0),in_RDI);
  if (((in_stack_ffffffffffffffe7 != 0) && (in_stack_ffffffffffffffe7 != 1)) &&
     (in_stack_ffffffffffffffe7 != 2)) {
    in_stack_ffffffffffffffe7 = 3;
  }
  *(uint *)(in_RDI + 8) = (uint)in_stack_ffffffffffffffe7;
  return;
}

Assistant:

void
LineOrderAttribute::readValueFrom (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is, int size, int version)
{
    unsigned char tmp;
    Xdr::read <StreamIO> (is, tmp);

    //
    // prevent invalid values being written to LineOrder enum
    // by forcing all unknown types to NUM_LINEORDERS which is also an invalid
    // value but is a legal enum. Note that Header::sanityCheck will
    // throw an exception when files with invalid lineOrders 
    //
    
    if (tmp != INCREASING_Y &&
        tmp != DECREASING_Y &&
        tmp != RANDOM_Y)
        tmp = NUM_LINEORDERS;

    _value = LineOrder (tmp);
}